

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O3

void __thiscall GibbsSamplerFromHDP::runIteraions(GibbsSamplerFromHDP *this)

{
  pointer puVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (this->_iterationNumber != 0) {
    uVar5 = 0;
    do {
      (*this->_vptr_GibbsSamplerFromHDP[1])(this);
      uVar3 = (ulong)this->_J;
      if (this->_J != 0) {
        puVar1 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          if (puVar1[uVar6] != 0) {
            uVar3 = 0;
            do {
              (*this->_vptr_GibbsSamplerFromHDP[2])(this,uVar6 & 0xffffffff,uVar3,0);
              uVar4 = (int)uVar3 + 1;
              uVar3 = (ulong)uVar4;
              puVar1 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            } while (uVar4 < puVar1[uVar6]);
            uVar3 = (ulong)this->_J;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar3);
      }
      (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
      (*this->_vptr_GibbsSamplerFromHDP[9])(this);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->_iterationNumber);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::runIteraions(){//{{{
    for(int i=0; i<_iterationNumber; i++){
        this->sampleTji();
        for(int j=0; j<_J; j++){
            for(int t=0; t<_Tj[j]; t++){
                this->sampleKjt(j, t);
            }
        }
        this->calculateExpectations(true);
        this->calculateLogLikelihood();
        // this->checkNumbers();
        cout<<_K<<endl;
        // if((i > _burnIn - 1) && ((i + 1) % _samplingInterval == 0)){
            // this->storeSamples();
        // }
    }
    // this->calculateExpectations();
}